

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  pointer pptVar1;
  pointer pptVar2;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar3;
  type_info *ptVar4;
  
  pvVar3 = all_type_info(type);
  pptVar1 = (pvVar3->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (pvVar3->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar2 == pptVar1) {
    ptVar4 = (type_info *)0x0;
  }
  else {
    if (8 < (ulong)((long)pptVar2 - (long)pptVar1)) {
      pybind11_fail("pybind11::detail::get_type_info: type has multiple pybind11-registered bases");
    }
    ptVar4 = *pptVar1;
  }
  return ptVar4;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info* get_type_info(PyTypeObject *type) {
    auto &bases = all_type_info(type);
    if (bases.size() == 0)
        return nullptr;
    if (bases.size() > 1)
        pybind11_fail("pybind11::detail::get_type_info: type has multiple pybind11-registered bases");
    return bases.front();
}